

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O1

iterator anon_unknown.dwarf_a40a3a::TransformConfigure
                   (TransformAction action,
                   unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
                   *selector,size_t arity)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_> *puVar2;
  byte bVar3;
  char cVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  TransformSelector *pTVar7;
  runtime_error *prVar8;
  _Link_type p_Var9;
  _Link_type p_Var10;
  _Link_type __p;
  _Base_ptr p_Var11;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar12;
  string local_a0;
  undefined8 local_78;
  long *plStack_70;
  _Rb_tree_color local_68;
  TransformAction local_64;
  _Base_ptr local_60;
  unique_ptr<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_> *local_58;
  string local_50;
  
  if ((anonymous_namespace)::Descriptors._64_8_ == 0) {
    __p = (_Link_type)selector;
    p_Var5 = (_Base_ptr)operator_new(0x30);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    p_Var5->_M_left = (_Base_ptr)0x0;
    p_Var5->_M_right = (_Base_ptr)0x0;
    *(undefined8 *)(p_Var5 + 1) = 0;
    p_Var5[1]._M_parent = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformActionAppend_00b34918;
    p_Var5->_M_left = p_Var5 + 1;
    p_Var5->_M_right = (_Base_ptr)0x0;
    *(undefined1 *)&p_Var5[1]._M_color = _S_red;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    paVar1 = &local_a0.field_2;
    local_a0.field_2._M_allocated_capacity._1_2_ = 0x5050;
    local_a0.field_2._M_local_buf[3] = 'E';
    local_a0.field_2._M_allocated_capacity._4_2_ = 0x444e;
    p_Var9 = (_Link_type)0x0;
    local_a0.field_2._M_local_buf[6] = '\0';
    p_Var6[1]._M_color = _S_red;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    *(undefined4 *)&p_Var6[1]._M_right = 0x45505041;
    *(undefined2 *)((long)&p_Var6[1]._M_right + 4) = 0x444e;
    *(undefined1 *)((long)&p_Var6[1]._M_right + 6) = 0;
    *(ulong *)((long)&p_Var6[1]._M_right + 7) =
         CONCAT17(local_a0.field_2._M_local_buf[0xe],
                  CONCAT25(local_a0.field_2._12_2_,
                           CONCAT14(local_a0.field_2._M_local_buf[0xb],
                                    CONCAT13(local_a0.field_2._M_local_buf[10],
                                             CONCAT12(local_a0.field_2._M_local_buf[9],
                                                      CONCAT11(local_a0.field_2._M_local_buf[8],
                                                               local_a0.field_2._M_local_buf[7])))))
                 );
    p_Var6[2].field_0x7 = local_a0.field_2._M_local_buf[0xf];
    p_Var6[1]._M_left = (_Base_ptr)0x6;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    p_Var6[2]._M_parent = (_Base_ptr)&DAT_00000001;
    p_Var6[2]._M_left = p_Var5;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    pVar12 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)__p);
    p_Var10 = (_Link_type)pVar12.second;
    if (p_Var10 == (_Link_type)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,__p);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar12.first,(_Base_ptr)p_Var10,p_Var6,p_Var9);
      __p = p_Var10;
    }
    p_Var5 = (_Base_ptr)operator_new(0x30);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    p_Var5->_M_left = (_Base_ptr)0x0;
    p_Var5->_M_right = (_Base_ptr)0x0;
    *(undefined8 *)(p_Var5 + 1) = 0;
    p_Var5[1]._M_parent = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformActionPrepend_00b34980;
    p_Var5->_M_left = p_Var5 + 1;
    p_Var5->_M_right = (_Base_ptr)0x0;
    *(undefined1 *)&p_Var5[1]._M_color = _S_red;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    local_a0.field_2._M_allocated_capacity._1_2_ = 0x4552;
    local_a0.field_2._M_local_buf[3] = 'P';
    local_a0.field_2._M_allocated_capacity._4_2_ = 0x4e45;
    local_a0.field_2._M_local_buf[6] = 'D';
    p_Var9 = (_Link_type)0x0;
    local_a0.field_2._M_local_buf[7] = '\0';
    p_Var6[1]._M_color = _S_black;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    *(undefined4 *)&p_Var6[1]._M_right = 0x50455250;
    *(undefined2 *)((long)&p_Var6[1]._M_right + 4) = 0x4e45;
    *(undefined1 *)((long)&p_Var6[1]._M_right + 6) = 0x44;
    *(undefined1 *)((long)&p_Var6[1]._M_right + 7) = 0;
    *(ulong *)(p_Var6 + 2) =
         CONCAT17(local_a0.field_2._M_local_buf[0xf],
                  CONCAT16(local_a0.field_2._M_local_buf[0xe],
                           CONCAT24(local_a0.field_2._12_2_,
                                    CONCAT13(local_a0.field_2._M_local_buf[0xb],
                                             CONCAT12(local_a0.field_2._M_local_buf[10],
                                                      CONCAT11(local_a0.field_2._M_local_buf[9],
                                                               local_a0.field_2._M_local_buf[8])))))
                 );
    p_Var6[1]._M_left = (_Base_ptr)0x7;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    p_Var6[2]._M_parent = (_Base_ptr)&DAT_00000001;
    p_Var6[2]._M_left = p_Var5;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    pVar12 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)__p);
    p_Var10 = (_Link_type)pVar12.second;
    if (p_Var10 == (_Link_type)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,__p);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar12.first,(_Base_ptr)p_Var10,p_Var6,p_Var9);
      __p = p_Var10;
    }
    p_Var5 = (_Base_ptr)operator_new(0x10);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformAction_00b349d8;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    local_a0.field_2._M_allocated_capacity._1_2_ = 0x554f;
    local_a0.field_2._M_local_buf[3] = 'P';
    local_a0.field_2._M_allocated_capacity._4_2_ = 0x4550;
    local_a0.field_2._M_local_buf[6] = 'R';
    p_Var9 = (_Link_type)0x0;
    local_a0.field_2._M_local_buf[7] = '\0';
    p_Var6[1]._M_color = 3;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    *(undefined4 *)&p_Var6[1]._M_right = 0x50554f54;
    *(undefined2 *)((long)&p_Var6[1]._M_right + 4) = 0x4550;
    *(undefined1 *)((long)&p_Var6[1]._M_right + 6) = 0x52;
    *(undefined1 *)((long)&p_Var6[1]._M_right + 7) = 0;
    *(ulong *)(p_Var6 + 2) =
         CONCAT17(local_a0.field_2._M_local_buf[0xf],
                  CONCAT16(local_a0.field_2._M_local_buf[0xe],
                           CONCAT24(local_a0.field_2._12_2_,
                                    CONCAT13(local_a0.field_2._M_local_buf[0xb],
                                             CONCAT12(local_a0.field_2._M_local_buf[10],
                                                      CONCAT11(local_a0.field_2._M_local_buf[9],
                                                               local_a0.field_2._M_local_buf[8])))))
                 );
    p_Var6[1]._M_left = (_Base_ptr)0x7;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    p_Var6[2]._M_parent = (_Base_ptr)0x0;
    p_Var6[2]._M_left = p_Var5;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    pVar12 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)__p);
    p_Var10 = (_Link_type)pVar12.second;
    if (p_Var10 == (_Link_type)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,__p);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar12.first,(_Base_ptr)p_Var10,p_Var6,p_Var9);
      __p = p_Var10;
    }
    p_Var5 = (_Base_ptr)operator_new(0x10);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformAction_00b34a30;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    local_a0.field_2._M_allocated_capacity._1_2_ = 0x4c4f;
    local_a0.field_2._M_local_buf[3] = 'O';
    local_a0.field_2._M_allocated_capacity._4_2_ = 0x4557;
    local_a0.field_2._M_local_buf[6] = 'R';
    p_Var9 = (_Link_type)0x0;
    local_a0.field_2._M_local_buf[7] = '\0';
    p_Var6[1]._M_color = 2;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    *(undefined4 *)&p_Var6[1]._M_right = 0x4f4c4f54;
    *(undefined2 *)((long)&p_Var6[1]._M_right + 4) = 0x4557;
    *(undefined1 *)((long)&p_Var6[1]._M_right + 6) = 0x52;
    *(undefined1 *)((long)&p_Var6[1]._M_right + 7) = 0;
    *(ulong *)(p_Var6 + 2) =
         CONCAT17(local_a0.field_2._M_local_buf[0xf],
                  CONCAT16(local_a0.field_2._M_local_buf[0xe],
                           CONCAT24(local_a0.field_2._12_2_,
                                    CONCAT13(local_a0.field_2._M_local_buf[0xb],
                                             CONCAT12(local_a0.field_2._M_local_buf[10],
                                                      CONCAT11(local_a0.field_2._M_local_buf[9],
                                                               local_a0.field_2._M_local_buf[8])))))
                 );
    p_Var6[1]._M_left = (_Base_ptr)0x7;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    p_Var6[2]._M_parent = (_Base_ptr)0x0;
    p_Var6[2]._M_left = p_Var5;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    pVar12 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)__p);
    p_Var10 = (_Link_type)pVar12.second;
    if (p_Var10 == (_Link_type)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,__p);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar12.first,(_Base_ptr)p_Var10,p_Var6,p_Var9);
      __p = p_Var10;
    }
    p_Var5 = (_Base_ptr)operator_new(0x10);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformAction_00b34a88;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    local_a0.field_2._M_allocated_capacity._1_2_ = 0x5254;
    local_a0.field_2._M_local_buf[3] = 'I';
    local_a0.field_2._M_allocated_capacity._4_2_ = 0x50;
    p_Var6[1]._M_color = 4;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    *(undefined4 *)&p_Var6[1]._M_right = 0x49525453;
    *(undefined2 *)((long)&p_Var6[1]._M_right + 4) = 0x50;
    *(ulong *)((long)&p_Var6[1]._M_right + 6) =
         CONCAT26(local_a0.field_2._12_2_,
                  CONCAT15(local_a0.field_2._M_local_buf[0xb],
                           CONCAT14(local_a0.field_2._M_local_buf[10],
                                    CONCAT13(local_a0.field_2._M_local_buf[9],
                                             CONCAT12(local_a0.field_2._M_local_buf[8],
                                                      CONCAT11(local_a0.field_2._M_local_buf[7],
                                                               local_a0.field_2._M_local_buf[6])))))
                 );
    p_Var9 = (_Link_type)
             (ulong)CONCAT11(local_a0.field_2._M_local_buf[0xf],local_a0.field_2._M_local_buf[0xe]);
    *(ushort *)&p_Var6[2].field_0x6 =
         CONCAT11(local_a0.field_2._M_local_buf[0xf],local_a0.field_2._M_local_buf[0xe]);
    p_Var6[1]._M_left = (_Base_ptr)0x5;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    p_Var6[2]._M_parent = (_Base_ptr)0x0;
    p_Var6[2]._M_left = p_Var5;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    pVar12 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)__p);
    p_Var10 = (_Link_type)pVar12.second;
    if (p_Var10 == (_Link_type)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,__p);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar12.first,(_Base_ptr)p_Var10,p_Var6,p_Var9);
      __p = p_Var10;
    }
    p_Var5 = (_Base_ptr)operator_new(0x10);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformAction_00b34ae0;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    local_a0.field_2._M_allocated_capacity._1_2_ = 0x4e45;
    local_a0.field_2._M_local_buf[3] = 'E';
    local_a0.field_2._M_allocated_capacity._4_2_ = 0x5f58;
    local_a0.field_2._M_local_buf[6] = 'S';
    local_a0.field_2._M_local_buf[7] = 'T';
    local_a0.field_2._M_local_buf[8] = 'R';
    local_a0.field_2._M_local_buf[9] = 'I';
    local_a0.field_2._M_local_buf[10] = 'P';
    p_Var9 = (_Link_type)0x0;
    local_a0.field_2._M_local_buf[0xb] = '\0';
    p_Var6[1]._M_color = 5;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    p_Var6[1]._M_right = (_Base_ptr)0x54535f58454e4547;
    *(undefined2 *)&p_Var6[2]._M_color = 0x4952;
    *(byte *)((long)&p_Var6[2]._M_color + 2) = 0x50;
    *(byte *)((long)&p_Var6[2]._M_color + 3) = 0;
    *(uint *)&p_Var6[2].field_0x4 =
         CONCAT13(local_a0.field_2._M_local_buf[0xf],
                  CONCAT12(local_a0.field_2._M_local_buf[0xe],local_a0.field_2._12_2_));
    p_Var6[1]._M_left = (_Base_ptr)0xb;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    p_Var6[2]._M_parent = (_Base_ptr)0x0;
    p_Var6[2]._M_left = p_Var5;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    pVar12 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)__p);
    p_Var10 = (_Link_type)pVar12.second;
    if (p_Var10 == (_Link_type)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,__p);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar12.first,(_Base_ptr)p_Var10,p_Var6,p_Var9);
      __p = p_Var10;
    }
    p_Var5 = (_Base_ptr)operator_new(0x18);
    *(undefined8 *)p_Var5 = 0;
    p_Var5->_M_parent = (_Base_ptr)0x0;
    p_Var5->_M_left = (_Base_ptr)0x0;
    *(undefined ***)p_Var5 = &PTR__TransformActionReplace_00b34b38;
    p_Var6 = (_Base_ptr)operator_new(0x58);
    local_a0.field_2._M_allocated_capacity._1_2_ = 0x5045;
    local_a0.field_2._M_local_buf[3] = 'L';
    local_a0.field_2._M_allocated_capacity._4_2_ = 0x4341;
    local_a0.field_2._M_local_buf[6] = 'E';
    p_Var9 = (_Link_type)0x0;
    local_a0.field_2._M_local_buf[7] = '\0';
    p_Var6[1]._M_color = 6;
    p_Var6[1]._M_parent = (_Base_ptr)&p_Var6[1]._M_right;
    *(undefined4 *)&p_Var6[1]._M_right = 0x4c504552;
    *(undefined2 *)((long)&p_Var6[1]._M_right + 4) = 0x4341;
    *(undefined1 *)((long)&p_Var6[1]._M_right + 6) = 0x45;
    *(undefined1 *)((long)&p_Var6[1]._M_right + 7) = 0;
    *(ulong *)(p_Var6 + 2) =
         CONCAT17(local_a0.field_2._M_local_buf[0xf],
                  CONCAT16(local_a0.field_2._M_local_buf[0xe],
                           CONCAT24(local_a0.field_2._12_2_,
                                    CONCAT13(local_a0.field_2._M_local_buf[0xb],
                                             CONCAT12(local_a0.field_2._M_local_buf[10],
                                                      CONCAT11(local_a0.field_2._M_local_buf[9],
                                                               local_a0.field_2._M_local_buf[8])))))
                 );
    p_Var6[1]._M_left = (_Base_ptr)0x7;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    p_Var6[2]._M_parent = (_Base_ptr)0x2;
    p_Var6[2]._M_left = p_Var5;
    local_a0._M_dataplus._M_p = (pointer)paVar1;
    pVar12 = std::
             _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
             ::_M_get_insert_unique_pos
                       ((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                         *)(p_Var6 + 1),(key_type *)__p);
    if (pVar12.second == (_Base_ptr)0x0) {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_drop_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                      *)p_Var6,__p);
    }
    else {
      std::
      _Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
      ::_M_insert_node((_Rb_tree<(anonymous_namespace)::ActionDescriptor,_(anonymous_namespace)::ActionDescriptor,_std::_Identity<(anonymous_namespace)::ActionDescriptor>,_std::function<bool_(cmList::TransformAction,_cmList::TransformAction)>,_std::allocator<(anonymous_namespace)::ActionDescriptor>_>
                        *)pVar12.first,pVar12.second,p_Var6,p_Var9);
    }
  }
  local_a0._M_string_length = (long)&local_a0.field_2 + 8;
  local_a0._M_dataplus._M_p._0_4_ = action;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_a0.field_2._M_allocated_capacity._1_2_ = 0;
  local_a0.field_2._M_local_buf[3] = '\0';
  local_a0.field_2._M_allocated_capacity._4_2_ = 0;
  local_a0.field_2._M_local_buf[6] = '\0';
  local_a0.field_2._M_local_buf[7] = '\0';
  local_a0.field_2._M_local_buf[8] = '\0';
  local_78 = 0;
  plStack_70 = (long *)0x0;
  p_Var6 = (_Base_ptr)((anonymous_namespace)::Descriptors + 0x20);
  local_64 = action;
  local_60 = (_Base_ptr)arity;
  local_58 = selector;
  if ((anonymous_namespace)::Descriptors._40_8_ != 0) {
    p_Var6 = (_Base_ptr)((anonymous_namespace)::Descriptors + 0x20);
    p_Var5 = (_Base_ptr)(anonymous_namespace)::Descriptors._40_8_;
    do {
      local_50._M_dataplus._M_p._0_4_ = p_Var5[1]._M_color;
      local_68 = (_Rb_tree_color)local_a0._M_dataplus._M_p;
      if ((anonymous_namespace)::Descriptors._16_8_ == 0) goto LAB_002c2097;
      bVar3 = (*(code *)(anonymous_namespace)::Descriptors._24_8_)
                        ((anonymous_namespace)::Descriptors,&local_50,&local_68);
      if (bVar3 == 0) {
        p_Var6 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[bVar3];
    } while (p_Var5 != (_Base_ptr)0x0);
  }
  p_Var11 = (_Base_ptr)((anonymous_namespace)::Descriptors + 0x20);
  if (p_Var6 != (_Base_ptr)((anonymous_namespace)::Descriptors + 0x20)) {
    local_68 = p_Var6[1]._M_color;
    local_50._M_dataplus._M_p._0_4_ = (_Rb_tree_color)local_a0._M_dataplus._M_p;
    if ((anonymous_namespace)::Descriptors._16_8_ == 0) {
LAB_002c2097:
      std::__throw_bad_function_call();
    }
    cVar4 = (*(code *)(anonymous_namespace)::Descriptors._24_8_)
                      ((anonymous_namespace)::Descriptors,&local_50,&local_68);
    p_Var11 = p_Var6;
    if (cVar4 != '\0') {
      p_Var11 = (_Base_ptr)((anonymous_namespace)::Descriptors + 0x20);
    }
  }
  if (plStack_70 != (long *)0x0) {
    (**(code **)(*plStack_70 + 8))();
  }
  puVar2 = local_58;
  plStack_70 = (long *)0x0;
  if ((undefined1 *)local_a0._M_string_length != (undefined1 *)((long)&local_a0.field_2 + 8)) {
    operator_delete((void *)local_a0._M_string_length,
                    CONCAT17(local_a0.field_2._M_local_buf[0xf],
                             CONCAT16(local_a0.field_2._M_local_buf[0xe],
                                      CONCAT24(local_a0.field_2._12_2_,
                                               CONCAT13(local_a0.field_2._M_local_buf[0xb],
                                                        CONCAT12(local_a0.field_2._M_local_buf[10],
                                                                 CONCAT11(local_a0.field_2.
                                                                          _M_local_buf[9],
                                                                          local_a0.field_2.
                                                                          _M_local_buf[8])))))) + 1)
    ;
  }
  if (p_Var11 == (_Base_ptr)((anonymous_namespace)::Descriptors + 0x20)) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_50,local_64);
    cmStrCat<char_const(&)[25],std::__cxx11::string,char_const(&)[17]>
              (&local_a0,(char (*) [25])" sub-command TRANSFORM, ",&local_50,
               (char (*) [17])" invalid action.");
    std::runtime_error::runtime_error(prVar8,(string *)&local_a0);
    *(undefined ***)prVar8 = &PTR__runtime_error_00b34df0;
    __cxa_throw(prVar8,&cmList::transform_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (p_Var11[2]._M_parent != local_60) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    cmStrCat<char_const(&)[31],std::__cxx11::string_const&,char_const(&)[10],unsigned_long_const&,char_const(&)[14]>
              (&local_a0,(char (*) [31])"sub-command TRANSFORM, action ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &p_Var11[1]._M_parent,(char (*) [10])" expects ",
               (unsigned_long *)&p_Var11[2]._M_parent,(char (*) [14])0x8cdc96);
    std::runtime_error::runtime_error(prVar8,(string *)&local_a0);
    *(undefined ***)prVar8 = &PTR__runtime_error_00b34df0;
    __cxa_throw(prVar8,&cmList::transform_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((puVar2->_M_t).
      super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
      ._M_t.
      super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
      .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl ==
      (TransformSelector *)0x0) {
    pTVar7 = (TransformSelector *)operator_new(0x28);
    pTVar7->_vptr_TransformSelector = (_func_int **)&PTR__TransformSelector_00b34c00;
    pTVar7[1]._vptr_TransformSelector = (_func_int **)(pTVar7 + 3);
    pTVar7[3]._vptr_TransformSelector = (_func_int **)0x43454c4553204f4e;
    *(undefined2 *)&pTVar7[4]._vptr_TransformSelector = 0x4f54;
    *(undefined1 *)((long)&pTVar7[4]._vptr_TransformSelector + 2) = 0x52;
    *(undefined1 *)((long)&pTVar7[4]._vptr_TransformSelector + 3) = 0;
    *(uint *)((long)&pTVar7[4]._vptr_TransformSelector + 4) =
         CONCAT13(local_a0.field_2._M_local_buf[0xf],
                  CONCAT12(local_a0.field_2._M_local_buf[0xe],local_a0.field_2._12_2_));
    pTVar7[2]._vptr_TransformSelector = (_func_int **)0xb;
    pTVar7->_vptr_TransformSelector = (_func_int **)&PTR__TransformSelector_00b34b90;
    (puVar2->_M_t).
    super___uniq_ptr_impl<cmList::TransformSelector,_std::default_delete<cmList::TransformSelector>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmList::TransformSelector_*,_std::default_delete<cmList::TransformSelector>_>
    .super__Head_base<0UL,_cmList::TransformSelector_*,_false>._M_head_impl = pTVar7;
  }
  return (iterator)p_Var11;
}

Assistant:

ActionDescriptorSet::iterator TransformConfigure(
  cmList::TransformAction action,
  std::unique_ptr<cmList::TransformSelector>& selector, std::size_t arity)
{
  if (Descriptors.empty()) {
    Descriptors.emplace(cmList::TransformAction::APPEND, "APPEND", 1,
                        cm::make_unique<TransformActionAppend>());
    Descriptors.emplace(cmList::TransformAction::PREPEND, "PREPEND", 1,
                        cm::make_unique<TransformActionPrepend>());
    Descriptors.emplace(cmList::TransformAction::TOUPPER, "TOUPPER", 0,
                        cm::make_unique<TransformActionToUpper>());
    Descriptors.emplace(cmList::TransformAction::TOLOWER, "TOLOWER", 0,
                        cm::make_unique<TransformActionToLower>());
    Descriptors.emplace(cmList::TransformAction::STRIP, "STRIP", 0,
                        cm::make_unique<TransformActionStrip>());
    Descriptors.emplace(cmList::TransformAction::GENEX_STRIP, "GENEX_STRIP", 0,
                        cm::make_unique<TransformActionGenexStrip>());
    Descriptors.emplace(cmList::TransformAction::REPLACE, "REPLACE", 2,
                        cm::make_unique<TransformActionReplace>());
  }

  auto descriptor = Descriptors.find(action);
  if (descriptor == Descriptors.end()) {
    throw transform_error(cmStrCat(" sub-command TRANSFORM, ",
                                   std::to_string(static_cast<int>(action)),
                                   " invalid action."));
  }

  if (descriptor->Arity != arity) {
    throw transform_error(cmStrCat("sub-command TRANSFORM, action ",
                                   descriptor->Name, " expects ",
                                   descriptor->Arity, " argument(s)."));
  }
  if (!selector) {
    selector = cm::make_unique<TransformNoSelector>();
  }

  return descriptor;
}